

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O1

int floor0_inverse2(vorbis_block *vb,vorbis_look_floor *i,void *memo,float *out)

{
  int iVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  float fVar15;
  float fVar16;
  
  lVar2 = *(long *)((long)i + 0x18);
  if (*(long *)(*(long *)((long)i + 8) + vb->W * 8) == 0) {
    lVar6 = (long)(int)vb->W;
    lVar9 = *(long *)((long)vb->vd->vi->codec_setup + lVar6 * 8) / 2;
    iVar1 = *i;
    dVar11 = atan((double)((float)*(long *)(lVar2 + 8) * 0.5 * 0.00074));
    fVar10 = (float)*(long *)(lVar2 + 8) * 0.5;
    dVar12 = atan((double)(fVar10 * fVar10 * 1.85e-08));
    lVar3 = *(long *)(lVar2 + 8);
    pvVar4 = malloc((lVar9 << 0x20) + 0x100000000 >> 0x1e);
    *(void **)(*(long *)((long)i + 8) + lVar6 * 8) = pvVar4;
    uVar8 = (uint)lVar9;
    if ((int)uVar8 < 1) {
      uVar7 = 0;
    }
    else {
      fVar10 = (float)(int)uVar8;
      uVar7 = 0;
      do {
        fVar15 = (float)(int)uVar7;
        dVar13 = atan((double)((((float)*(long *)(lVar2 + 8) * 0.5) / fVar10) * fVar15 * 0.00074));
        fVar16 = (((float)*(long *)(lVar2 + 8) * 0.5) / fVar10) * fVar15;
        dVar14 = atan((double)(fVar16 * fVar16 * 1.85e-08));
        dVar13 = floor((dVar14 * 2.240000009536743 + dVar13 * 13.100000381469727 +
                       (double)((((float)*(long *)(lVar2 + 8) * 0.5) / fVar10) * fVar15 * 0.0001)) *
                       (double)(float)((double)iVar1 /
                                      ((double)((float)lVar3 * 0.5 * 0.0001) +
                                      dVar11 * 13.100000381469727 + dVar12 * 2.240000009536743)));
        iVar5 = *i + -1;
        if ((int)dVar13 < *i) {
          iVar5 = (int)dVar13;
        }
        *(int *)(*(long *)(*(long *)((long)i + 8) + lVar6 * 8) + uVar7 * 4) = iVar5;
        uVar7 = uVar7 + 1;
      } while ((uVar8 & 0x7fffffff) != uVar7);
      uVar7 = uVar7 & 0xffffffff;
    }
    *(undefined4 *)(*(long *)(*(long *)((long)i + 8) + lVar6 * 8) + uVar7 * 4) = 0xffffffff;
    *(uint *)((long)i + lVar6 * 4 + 0x10) = uVar8;
  }
  if (memo == (void *)0x0) {
    memset(out,0,(long)*(int *)((long)i + vb->W * 4 + 0x10) << 2);
  }
  else {
    vorbis_lsp_to_curve(out,*(int **)(*(long *)((long)i + 8) + vb->W * 8),
                        *(int *)((long)i + vb->W * 4 + 0x10),*i,(float *)memo,*(int *)((long)i + 4),
                        *(float *)((long)memo + (long)*(int *)((long)i + 4) * 4),
                        (float)*(int *)(lVar2 + 0x1c));
  }
  return (uint)(memo != (void *)0x0);
}

Assistant:

static int floor0_inverse2(vorbis_block *vb,vorbis_look_floor *i,
                           void *memo,float *out){
  vorbis_look_floor0 *look=(vorbis_look_floor0 *)i;
  vorbis_info_floor0 *info=look->vi;

  floor0_map_lazy_init(vb,info,look);

  if(memo){
    float *lsp=(float *)memo;
    float amp=lsp[look->m];

    /* take the coefficients back to a spectral envelope curve */
    vorbis_lsp_to_curve(out,
                        look->linearmap[vb->W],
                        look->n[vb->W],
                        look->ln,
                        lsp,look->m,amp,(float)info->ampdB);
    return(1);
  }
  memset(out,0,sizeof(*out)*look->n[vb->W]);
  return(0);
}